

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
emplace<QTlsPrivate::X509CertificateBase::X509CertificateExtension_const&>
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          qsizetype i,X509CertificateExtension *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *in_RSI;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  X509CertificateExtension tmp;
  X509CertificateExtension *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff34;
  byte bVar6;
  GrowthPosition where;
  Inserter local_b0;
  undefined1 local_60 [88];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::needsDetach
                    ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                      *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                   in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
                freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::end
                ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                ((X509CertificateExtension *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0011a282;
    }
    if ((in_RSI == (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                   0x0) &&
       (qVar3 = QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
                freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::begin
                ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
                 0x11a14a);
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
                ((X509CertificateExtension *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0011a282;
    }
  }
  memset(local_60,0xaa,0x58);
  QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
            ((X509CertificateExtension *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                              *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                                     *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff34,uVar2))),
             (X509CertificateExtension **)in_RDI,
             (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
             CONCAT17(uVar5,in_stack_ffffffffffffff20));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_b0,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff34,uVar2))),
                        (qsizetype)in_RDI,
                        (X509CertificateExtension *)CONCAT17(uVar5,in_stack_ffffffffffffff20));
    Inserter::~Inserter(&local_b0);
  }
  else {
    QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::begin
              ((QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)
               0x11a212);
    QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
              ((X509CertificateExtension *)CONCAT17(uVar5,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QTlsPrivate::X509CertificateBase::X509CertificateExtension::~X509CertificateExtension
            ((X509CertificateExtension *)CONCAT17(uVar5,in_stack_ffffffffffffff20));
LAB_0011a282:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }